

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

bool __thiscall
QPDFObjectHandle::isStreamOfType(QPDFObjectHandle *this,string *type,string *subtype)

{
  bool bVar1;
  QPDFObjectHandle local_30;
  
  bVar1 = isStream(this);
  if (bVar1) {
    getDict(&local_30);
    bVar1 = isDictionaryOfType(&local_30,type,subtype);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::isStreamOfType(std::string const& type, std::string const& subtype) const
{
    return isStream() && getDict().isDictionaryOfType(type, subtype);
}